

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O0

void __thiscall Assimp::XFileParser::ParseDataObjectSkinWeights(XFileParser *this,Mesh *pMesh)

{
  vector<Assimp::XFile::Bone,_std::allocator<Assimp::XFile::Bone>_> *this_00;
  reference this_01;
  reference pvVar1;
  ai_real aVar2;
  ai_real local_e4;
  uint local_e0;
  uint a_1;
  BoneWeight weight;
  uint a;
  uint numWeights;
  Bone *bone;
  size_type sStack_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_b8;
  pointer local_a8;
  pointer pBStack_a0;
  pointer local_98;
  aiMatrix4x4 aStack_90;
  undefined1 local_38 [8];
  string transformNodeName;
  Mesh *pMesh_local;
  XFileParser *this_local;
  
  if (pMesh != (Mesh *)0x0) {
    transformNodeName.field_2._8_8_ = pMesh;
    readHeadOfDataObject(this,(string *)0x0);
    std::__cxx11::string::string((string *)local_38);
    GetNextTokenAsString(this,(string *)local_38);
    this_00 = (vector<Assimp::XFile::Bone,_std::allocator<Assimp::XFile::Bone>_> *)
              (transformNodeName.field_2._8_8_ + 0x240);
    aStack_90.c3 = 0.0;
    aStack_90.c4 = 0.0;
    aStack_90.d1 = 0.0;
    aStack_90.d2 = 0.0;
    aStack_90.b3 = 0.0;
    aStack_90.b4 = 0.0;
    aStack_90.c1 = 0.0;
    aStack_90.c2 = 0.0;
    aStack_90.a3 = 0.0;
    aStack_90.a4 = 0.0;
    aStack_90.b1 = 0.0;
    aStack_90.b2 = 0.0;
    local_98 = (pointer)0x0;
    aStack_90.a1 = 0.0;
    aStack_90.a2 = 0.0;
    local_a8 = (pointer)0x0;
    pBStack_a0 = (pointer)0x0;
    local_b8._M_allocated_capacity = 0;
    local_b8._8_8_ = 0;
    bone = (Bone *)0x0;
    sStack_c0 = 0;
    aStack_90.d3 = 0.0;
    aStack_90.d4 = 0.0;
    XFile::Bone::Bone((Bone *)&bone);
    std::vector<Assimp::XFile::Bone,_std::allocator<Assimp::XFile::Bone>_>::push_back
              (this_00,(Bone *)&bone);
    XFile::Bone::~Bone((Bone *)&bone);
    this_01 = std::vector<Assimp::XFile::Bone,_std::allocator<Assimp::XFile::Bone>_>::back
                        ((vector<Assimp::XFile::Bone,_std::allocator<Assimp::XFile::Bone>_> *)
                         (transformNodeName.field_2._8_8_ + 0x240));
    std::__cxx11::string::operator=((string *)this_01,(string *)local_38);
    weight.mWeight = (ai_real)ReadInt(this);
    std::vector<Assimp::XFile::BoneWeight,_std::allocator<Assimp::XFile::BoneWeight>_>::reserve
              (&this_01->mWeights,(ulong)(uint)weight.mWeight);
    for (weight.mVertex = 0; weight.mVertex < (uint)weight.mWeight;
        weight.mVertex = weight.mVertex + 1) {
      local_e0 = ReadInt(this);
      std::vector<Assimp::XFile::BoneWeight,_std::allocator<Assimp::XFile::BoneWeight>_>::push_back
                (&this_01->mWeights,(value_type *)&stack0xffffffffffffff20);
    }
    for (local_e4 = 0.0; (uint)local_e4 < (uint)weight.mWeight;
        local_e4 = (ai_real)((int)local_e4 + 1)) {
      aVar2 = ReadFloat(this);
      pvVar1 = std::vector<Assimp::XFile::BoneWeight,_std::allocator<Assimp::XFile::BoneWeight>_>::
               operator[](&this_01->mWeights,(ulong)(uint)local_e4);
      pvVar1->mWeight = aVar2;
    }
    aVar2 = ReadFloat(this);
    (this_01->mOffsetMatrix).a1 = aVar2;
    aVar2 = ReadFloat(this);
    (this_01->mOffsetMatrix).b1 = aVar2;
    aVar2 = ReadFloat(this);
    (this_01->mOffsetMatrix).c1 = aVar2;
    aVar2 = ReadFloat(this);
    (this_01->mOffsetMatrix).d1 = aVar2;
    aVar2 = ReadFloat(this);
    (this_01->mOffsetMatrix).a2 = aVar2;
    aVar2 = ReadFloat(this);
    (this_01->mOffsetMatrix).b2 = aVar2;
    aVar2 = ReadFloat(this);
    (this_01->mOffsetMatrix).c2 = aVar2;
    aVar2 = ReadFloat(this);
    (this_01->mOffsetMatrix).d2 = aVar2;
    aVar2 = ReadFloat(this);
    (this_01->mOffsetMatrix).a3 = aVar2;
    aVar2 = ReadFloat(this);
    (this_01->mOffsetMatrix).b3 = aVar2;
    aVar2 = ReadFloat(this);
    (this_01->mOffsetMatrix).c3 = aVar2;
    aVar2 = ReadFloat(this);
    (this_01->mOffsetMatrix).d3 = aVar2;
    aVar2 = ReadFloat(this);
    (this_01->mOffsetMatrix).a4 = aVar2;
    aVar2 = ReadFloat(this);
    (this_01->mOffsetMatrix).b4 = aVar2;
    aVar2 = ReadFloat(this);
    (this_01->mOffsetMatrix).c4 = aVar2;
    aVar2 = ReadFloat(this);
    (this_01->mOffsetMatrix).d4 = aVar2;
    CheckForSemicolon(this);
    CheckForClosingBrace(this);
    std::__cxx11::string::~string((string *)local_38);
  }
  return;
}

Assistant:

void XFileParser::ParseDataObjectSkinWeights( Mesh *pMesh) {
    if ( nullptr == pMesh ) {
        return;
    }
    readHeadOfDataObject();

    std::string transformNodeName;
    GetNextTokenAsString( transformNodeName);

    pMesh->mBones.push_back( Bone());
    Bone& bone = pMesh->mBones.back();
    bone.mName = transformNodeName;

    // read vertex weights
    unsigned int numWeights = ReadInt();
    bone.mWeights.reserve( numWeights);

    for( unsigned int a = 0; a < numWeights; a++)
    {
        BoneWeight weight;
        weight.mVertex = ReadInt();
        bone.mWeights.push_back( weight);
    }

    // read vertex weights
    for( unsigned int a = 0; a < numWeights; a++)
        bone.mWeights[a].mWeight = ReadFloat();

    // read matrix offset
    bone.mOffsetMatrix.a1 = ReadFloat(); bone.mOffsetMatrix.b1 = ReadFloat();
    bone.mOffsetMatrix.c1 = ReadFloat(); bone.mOffsetMatrix.d1 = ReadFloat();
    bone.mOffsetMatrix.a2 = ReadFloat(); bone.mOffsetMatrix.b2 = ReadFloat();
    bone.mOffsetMatrix.c2 = ReadFloat(); bone.mOffsetMatrix.d2 = ReadFloat();
    bone.mOffsetMatrix.a3 = ReadFloat(); bone.mOffsetMatrix.b3 = ReadFloat();
    bone.mOffsetMatrix.c3 = ReadFloat(); bone.mOffsetMatrix.d3 = ReadFloat();
    bone.mOffsetMatrix.a4 = ReadFloat(); bone.mOffsetMatrix.b4 = ReadFloat();
    bone.mOffsetMatrix.c4 = ReadFloat(); bone.mOffsetMatrix.d4 = ReadFloat();

    CheckForSemicolon();
    CheckForClosingBrace();
}